

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O3

int __thiscall ncnn::InnerProduct_x86_fma::create_pipeline(InnerProduct_x86_fma *this,Option *opt)

{
  Mat *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint _h;
  int *piVar13;
  void *pvVar14;
  Allocator *pAVar15;
  size_t sVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  int iVar21;
  int iVar22;
  int iVar23;
  Layer *pLVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  undefined4 *puVar38;
  undefined4 *puVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  uint _w;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  ParamDict pd;
  long local_128;
  long local_110;
  uint local_e8;
  long local_c8;
  long local_c0;
  Mat local_b8;
  long local_70;
  void *local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pLVar24 = create_layer_cpu(0xe);
  this->flatten = pLVar24;
  ParamDict::ParamDict((ParamDict *)&local_b8);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_b8);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_b8);
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar23 = cpu_support_x86_f16c();
  if ((iVar23 != 0) && (opt->use_fp16_storage == true)) {
    create_pipeline_fp16s(this,opt);
    return 0;
  }
  _h = (this->super_InnerProduct).num_output;
  iVar23 = (this->super_InnerProduct).weight_data_size;
  _w = iVar23 / (int)_h;
  this_00 = &(this->super_InnerProduct).weight_data;
  if (opt->use_packing_layout == true) {
    if ((_h & 7) == 0) {
      Mat::reshape(&local_b8,this_00,_w,_h,(Allocator *)0x0);
      Mat::create(&this->weight_data_tm,_w,(int)_h >> 3,0x20,8,(Allocator *)0x0);
      if (7 < (int)_h) {
        lVar28 = 1;
        lVar31 = 2;
        lVar43 = 7;
        lVar29 = 5;
        lVar27 = 4;
        local_c0 = 3;
        local_c8 = 0;
        lVar40 = 6;
        uVar36 = 0;
        do {
          local_38 = lVar40;
          lVar40 = (long)(this->weight_data_tm).w;
          pvVar14 = (this->weight_data_tm).data;
          sVar16 = (this->weight_data_tm).elemsize;
          puVar38 = (undefined4 *)((uVar36 >> 3) * lVar40 * sVar16 + (long)pvVar14);
          lVar41 = (long)local_b8.w;
          if ((int)_w < 8) {
            lVar41 = local_b8.elemsize * lVar41;
            lVar40 = lVar41 * uVar36;
            lVar35 = (uVar36 | 1) * lVar41;
            lVar25 = (uVar36 | 2) * lVar41;
            lVar30 = (uVar36 | 3) * lVar41;
            lVar34 = (uVar36 | 4) * lVar41;
            lVar33 = (uVar36 | 5) * lVar41;
            lVar26 = (uVar36 | 6) * lVar41;
            lVar42 = lVar41 * (uVar36 | 7);
            uVar32 = 0;
          }
          else {
            lVar40 = sVar16 * local_c8 * lVar40;
            local_58 = local_b8.elemsize * uVar36 * lVar41;
            local_60 = local_b8.elemsize * lVar28 * lVar41;
            lVar25 = local_b8.elemsize * lVar31 * lVar41;
            local_70 = local_b8.elemsize * lVar43 * lVar41;
            lVar26 = local_b8.elemsize * local_38 * lVar41;
            lVar33 = local_b8.elemsize * lVar29 * lVar41;
            lVar34 = local_b8.elemsize * lVar27 * lVar41;
            lVar41 = local_b8.elemsize * local_c0 * lVar41;
            local_68 = local_b8.data;
            iVar23 = 7;
            lVar30 = 0;
            do {
              auVar5 = *(undefined1 (*) [32])((long)local_b8.data + lVar30 + local_58);
              auVar6 = *(undefined1 (*) [32])((long)local_b8.data + lVar30 + local_60);
              auVar7 = *(undefined1 (*) [32])((long)local_b8.data + lVar30 + lVar25);
              auVar8 = *(undefined1 (*) [32])((long)local_b8.data + lVar30 + lVar41);
              auVar9 = *(undefined1 (*) [32])((long)local_b8.data + lVar30 + lVar34);
              auVar10 = *(undefined1 (*) [32])((long)local_b8.data + lVar30 + lVar33);
              auVar11 = *(undefined1 (*) [32])((long)local_b8.data + lVar30 + lVar26);
              auVar12 = *(undefined1 (*) [32])((long)local_b8.data + lVar30 + local_70);
              auVar20 = vunpcklps_avx(auVar5,auVar6);
              auVar6 = vunpckhps_avx(auVar5,auVar6);
              auVar5 = vunpcklps_avx(auVar7,auVar8);
              auVar7 = vunpckhps_avx(auVar7,auVar8);
              auVar44 = vunpcklps_avx(auVar9,auVar10);
              auVar8 = vunpckhps_avx(auVar9,auVar10);
              auVar45 = vunpcklps_avx(auVar11,auVar12);
              auVar9 = vunpckhps_avx(auVar11,auVar12);
              auVar10 = vunpcklpd_avx(auVar20,auVar5);
              auVar5 = vunpckhpd_avx(auVar20,auVar5);
              auVar11 = vunpcklpd_avx(auVar6,auVar7);
              auVar6 = vunpckhpd_avx(auVar6,auVar7);
              auVar12 = vunpcklpd_avx(auVar44,auVar45);
              auVar7 = vunpckhpd_avx(auVar44,auVar45);
              auVar20 = vunpcklpd_avx(auVar8,auVar9);
              auVar8 = vunpckhpd_avx(auVar8,auVar9);
              auVar44._16_16_ = auVar12._0_16_;
              auVar44._0_16_ = auVar10._0_16_;
              auVar45._16_16_ = auVar7._0_16_;
              auVar45._0_16_ = auVar5._0_16_;
              auVar46._16_16_ = auVar20._0_16_;
              auVar46._0_16_ = auVar11._0_16_;
              auVar47._16_16_ = auVar8._0_16_;
              auVar47._0_16_ = auVar6._0_16_;
              auVar9 = vperm2f128_avx(auVar10,auVar12,0x31);
              auVar5 = vperm2f128_avx(auVar5,auVar7,0x31);
              auVar7 = vperm2f128_avx(auVar11,auVar20,0x31);
              auVar6 = vperm2f128_avx(auVar6,auVar8,0x31);
              *(undefined1 (*) [32])((long)pvVar14 + lVar30 * 8 + lVar40) = auVar44;
              *(undefined1 (*) [32])((long)pvVar14 + lVar30 * 8 + lVar40 + 0x20) = auVar45;
              *(undefined1 (*) [32])((long)pvVar14 + lVar30 * 8 + lVar40 + 0x40) = auVar46;
              *(undefined1 (*) [32])((long)pvVar14 + lVar30 * 8 + lVar40 + 0x60) = auVar47;
              *(undefined1 (*) [32])((long)pvVar14 + lVar30 * 8 + lVar40 + 0x80) = auVar9;
              *(undefined1 (*) [32])((long)pvVar14 + lVar30 * 8 + lVar40 + 0xa0) = auVar5;
              *(undefined1 (*) [32])((long)pvVar14 + lVar30 * 8 + lVar40 + 0xc0) = auVar7;
              *(undefined1 (*) [32])((long)pvVar14 + lVar30 * 8 + lVar40 + 0xe0) = auVar6;
              puVar38 = puVar38 + 0x40;
              lVar30 = lVar30 + 0x20;
              iVar23 = iVar23 + 8;
            } while (iVar23 < (int)_w);
            lVar40 = local_58 + lVar30;
            lVar35 = local_60 + lVar30;
            lVar25 = lVar25 + lVar30;
            lVar42 = local_70 + lVar30;
            lVar26 = lVar26 + lVar30;
            lVar33 = lVar33 + lVar30;
            lVar34 = lVar34 + lVar30;
            lVar30 = lVar41 + lVar30;
            uVar32 = _w & 0xfffffff8;
            local_50 = uVar36;
            local_48 = lVar29;
            local_40 = lVar28;
          }
          if ((int)uVar32 < (int)_w) {
            lVar41 = 0;
            do {
              *puVar38 = *(undefined4 *)((long)local_b8.data + lVar41 * 4 + lVar40);
              puVar38[1] = *(undefined4 *)((long)local_b8.data + lVar41 * 4 + lVar35);
              puVar38[2] = *(undefined4 *)((long)local_b8.data + lVar41 * 4 + lVar25);
              puVar38[3] = *(undefined4 *)((long)local_b8.data + lVar41 * 4 + lVar30);
              puVar38[4] = *(undefined4 *)((long)local_b8.data + lVar41 * 4 + lVar34);
              puVar38[5] = *(undefined4 *)((long)local_b8.data + lVar41 * 4 + lVar33);
              puVar38[6] = *(undefined4 *)((long)local_b8.data + lVar41 * 4 + lVar26);
              puVar38[7] = *(undefined4 *)((long)local_b8.data + lVar41 * 4 + lVar42);
              puVar38 = puVar38 + 8;
              lVar41 = lVar41 + 1;
            } while (_w - uVar32 != (int)lVar41);
          }
          uVar37 = uVar36 + 0xf;
          local_c8 = local_c8 + 1;
          lVar28 = lVar28 + 8;
          lVar31 = lVar31 + 8;
          lVar43 = lVar43 + 8;
          lVar29 = lVar29 + 8;
          lVar27 = lVar27 + 8;
          local_c0 = local_c0 + 8;
          lVar40 = local_38 + 8;
          uVar36 = uVar36 + 8;
        } while (uVar37 < _h);
      }
      if (local_b8.refcount == (int *)0x0) goto LAB_002e0fd5;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto LAB_002e0fd5;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto LAB_002e0fd5;
      }
    }
    else {
      if ((_h & 3) != 0) goto LAB_002e07a3;
      Mat::reshape(&local_b8,this_00,_w,_h,(Allocator *)0x0);
      Mat::create(&this->weight_data_tm,_w,(int)_h >> 2,0x10,4,(Allocator *)0x0);
      if (3 < (int)_h) {
        local_e8 = _w & 0xfffffffc;
        lVar43 = 3;
        lVar40 = 2;
        local_110 = 1;
        local_128 = 0;
        uVar36 = 0;
        do {
          lVar29 = (long)(this->weight_data_tm).w;
          pvVar14 = (this->weight_data_tm).data;
          sVar16 = (this->weight_data_tm).elemsize;
          puVar38 = (undefined4 *)((uVar36 >> 2) * lVar29 * sVar16 + (long)pvVar14);
          lVar28 = (long)local_b8.w;
          if ((int)_w < 4) {
            lVar28 = local_b8.elemsize * lVar28;
            lVar35 = lVar28 * uVar36;
            lVar41 = (uVar36 | 1) * lVar28;
            lVar31 = (uVar36 | 2) * lVar28;
            lVar27 = lVar28 * (uVar36 | 3);
            uVar32 = 0;
          }
          else {
            lVar27 = local_b8.elemsize * lVar43 * lVar28;
            lVar31 = local_b8.elemsize * lVar40 * lVar28;
            lVar41 = local_b8.elemsize * local_110 * lVar28;
            lVar28 = local_b8.elemsize * uVar36 * lVar28;
            iVar23 = 3;
            lVar35 = 0;
            do {
              puVar39 = puVar38;
              auVar1 = *(undefined1 (*) [16])((long)local_b8.data + lVar35 + lVar28);
              auVar2 = *(undefined1 (*) [16])((long)local_b8.data + lVar35 + lVar41);
              auVar3 = *(undefined1 (*) [16])((long)local_b8.data + lVar35 + lVar31);
              auVar4 = *(undefined1 (*) [16])((long)local_b8.data + lVar35 + lVar27);
              auVar18 = vunpcklps_avx(auVar1,auVar2);
              auVar19 = vunpcklps_avx(auVar3,auVar4);
              auVar17 = vunpckhps_avx(auVar1,auVar2);
              auVar4 = vunpckhps_avx(auVar3,auVar4);
              auVar1 = vmovlhps_avx(auVar18,auVar19);
              auVar3 = vunpckhpd_avx(auVar18,auVar19);
              auVar2 = vmovlhps_avx(auVar17,auVar4);
              auVar4 = vunpckhpd_avx(auVar17,auVar4);
              puVar38 = (undefined4 *)
                        ((long)pvVar14 + lVar35 * 4 + sVar16 * local_128 * lVar29 + 0x40);
              *(undefined1 (*) [16])(puVar38 + -0x10) = auVar1;
              *(undefined1 (*) [16])(puVar38 + -0xc) = auVar3;
              *(undefined1 (*) [16])(puVar38 + -8) = auVar2;
              *(undefined1 (*) [16])(puVar38 + -4) = auVar4;
              iVar23 = iVar23 + 4;
              lVar35 = lVar35 + 0x10;
            } while (iVar23 < (int)_w);
            puVar38 = puVar39 + 0x10;
            lVar27 = lVar27 + lVar35;
            lVar31 = lVar31 + lVar35;
            lVar41 = lVar41 + lVar35;
            lVar35 = lVar28 + lVar35;
            uVar32 = local_e8;
          }
          if ((int)uVar32 < (int)_w) {
            lVar28 = 0;
            do {
              *puVar38 = *(undefined4 *)((long)local_b8.data + lVar28 * 4 + lVar35);
              puVar38[1] = *(undefined4 *)((long)local_b8.data + lVar28 * 4 + lVar41);
              puVar38[2] = *(undefined4 *)((long)local_b8.data + lVar28 * 4 + lVar31);
              puVar38[3] = *(undefined4 *)((long)local_b8.data + lVar28 * 4 + lVar27);
              puVar38 = puVar38 + 4;
              lVar28 = lVar28 + 1;
            } while (_w - uVar32 != (int)lVar28);
          }
          uVar37 = uVar36 + 7;
          lVar43 = lVar43 + 4;
          lVar40 = lVar40 + 4;
          local_110 = local_110 + 4;
          local_128 = local_128 + 1;
          uVar36 = uVar36 + 4;
        } while (uVar37 < _h);
      }
      if (local_b8.refcount == (int *)0x0) goto LAB_002e0fd5;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto LAB_002e0fd5;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto LAB_002e0fd5;
      }
    }
    if (local_b8.data != (void *)0x0) {
      free(local_b8.data);
    }
  }
  else {
LAB_002e07a3:
    piVar13 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    piVar13 = (this->weight_data_tm).refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        pvVar14 = (this->weight_data_tm).data;
        pAVar15 = (this->weight_data_tm).allocator;
        if (pAVar15 == (Allocator *)0x0) {
          if (pvVar14 != (void *)0x0) {
            free(pvVar14);
          }
        }
        else {
          (*pAVar15->_vptr_Allocator[3])(pAVar15,pvVar14,(long)iVar23 % (long)(int)_h & 0xffffffff);
        }
      }
    }
    piVar13 = (this->super_InnerProduct).weight_data.refcount;
    (this->weight_data_tm).data = (this->super_InnerProduct).weight_data.data;
    (this->weight_data_tm).refcount = piVar13;
    (this->weight_data_tm).elemsize = (this->super_InnerProduct).weight_data.elemsize;
    (this->weight_data_tm).elempack = (this->super_InnerProduct).weight_data.elempack;
    (this->weight_data_tm).allocator = (this->super_InnerProduct).weight_data.allocator;
    iVar23 = (this->super_InnerProduct).weight_data.w;
    iVar21 = (this->super_InnerProduct).weight_data.h;
    iVar22 = (this->super_InnerProduct).weight_data.d;
    (this->weight_data_tm).dims = (this->super_InnerProduct).weight_data.dims;
    (this->weight_data_tm).w = iVar23;
    (this->weight_data_tm).h = iVar21;
    (this->weight_data_tm).d = iVar22;
    (this->weight_data_tm).c = (this->super_InnerProduct).weight_data.c;
    (this->weight_data_tm).cstep = (this->super_InnerProduct).weight_data.cstep;
  }
LAB_002e0fd5:
  if (opt->lightmode == true) {
    piVar13 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        pvVar14 = (this->super_InnerProduct).weight_data.data;
        pAVar15 = (this->super_InnerProduct).weight_data.allocator;
        if (pAVar15 == (Allocator *)0x0) {
          if (pvVar14 != (void *)0x0) {
            free(pvVar14);
          }
        }
        else {
          (*pAVar15->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_InnerProduct).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.elemsize + 4) = 0;
    this_00->data = (void *)0x0;
    (this->super_InnerProduct).weight_data.refcount = (int *)0x0;
    (this->super_InnerProduct).weight_data.dims = 0;
    (this->super_InnerProduct).weight_data.w = 0;
    (this->super_InnerProduct).weight_data.h = 0;
    (this->super_InnerProduct).weight_data.d = 0;
    (this->super_InnerProduct).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_fma::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer_cpu(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}